

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Value * __thiscall GlobOpt::NewGenericValue(GlobOpt *this,ValueType valueType,Sym *sym)

{
  ValueInfo *this_00;
  Value *value;
  
  this_00 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x18,this->alloc,0x3f1274);
  ValueInfo::ValueInfo(this_00,valueType,Generic);
  value = NewValue(this,this_00);
  TrackNewValueForKills(this,value);
  GlobOptBlockData::SetValue(&this->currentBlock->globOptData,value,sym);
  return value;
}

Assistant:

Value *
GlobOpt::NewGenericValue(const ValueType valueType, Sym *const sym)
{
    ValueInfo *valueInfo = ValueInfo::New(this->alloc, valueType);
    Value *val = NewValue(valueInfo);
    TrackNewValueForKills(val);

    CurrentBlockData()->SetValue(val, sym);
    return val;
}